

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O3

int __thiscall
ncnn::UnaryOp_x86::forward_inplace(UnaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  float *pfVar5;
  long lVar6;
  undefined1 (*pauVar7) [16];
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  int iVar23;
  float fVar24;
  undefined1 in_XMM0 [16];
  undefined1 auVar14 [16];
  int iVar25;
  int iVar28;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar26;
  uint uVar27;
  uint uVar29;
  uint uVar30;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar31;
  float fVar32;
  float fVar43;
  float fVar44;
  undefined1 in_XMM1 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar45;
  float fVar46;
  undefined1 auVar42 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar70;
  undefined1 auVar66 [16];
  float fVar71;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar72;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar78;
  
  auVar64 = _DAT_005a8120;
  switch((this->super_UnaryOp).op_type) {
  case 0:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar33._0_8_ = *(ulong *)*pauVar7 & 0x7fffffff7fffffff;
            auVar33._8_4_ = *(uint *)((long)*pauVar7 + 8) & 0x7fffffff;
            auVar33._12_4_ = *(uint *)((long)*pauVar7 + 0xc) & 0x7fffffff;
            *pauVar7 = auVar33;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            *(uint *)((long)*pauVar7 + lVar8 * 4) =
                 *(uint *)((long)*pauVar7 + lVar8 * 4) & 0x7fffffff;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 1:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar40._0_8_ = *(ulong *)*pauVar7 ^ 0x8000000080000000;
            auVar40._8_4_ = *(uint *)((long)*pauVar7 + 8) ^ 0x80000000;
            auVar40._12_4_ = *(uint *)((long)*pauVar7 + 0xc) ^ 0x80000000;
            *pauVar7 = auVar40;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            *(uint *)((long)*pauVar7 + lVar8 * 4) =
                 *(uint *)((long)*pauVar7 + lVar8 * 4) ^ 0x80000000;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 2:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar64 = *pauVar7;
            fVar13 = auVar64._0_4_;
            fVar32 = auVar64._4_4_;
            fVar24 = auVar64._8_4_;
            fVar43 = auVar64._12_4_;
            uVar9 = -(uint)(ABS(fVar13) <= 8388608.0);
            uVar10 = -(uint)(ABS(fVar32) <= 8388608.0);
            uVar11 = -(uint)(ABS(fVar24) <= 8388608.0);
            uVar12 = -(uint)(ABS(fVar43) <= 8388608.0);
            fVar31 = (float)((uint)(float)(int)ABS(fVar13) | (uint)fVar13 & 0x80000000);
            fVar45 = (float)((uint)(float)(int)ABS(fVar32) | (uint)fVar32 & 0x80000000);
            fVar44 = (float)((uint)(float)(int)ABS(fVar24) | (uint)fVar24 & 0x80000000);
            fVar46 = (float)((uint)(float)(int)ABS(fVar43) | (uint)fVar43 & 0x80000000);
            auVar61._0_4_ = (uint)(fVar31 - (float)(-(uint)(fVar13 < fVar31) & 0x3f800000)) & uVar9;
            auVar61._4_4_ = (uint)(fVar45 - (float)(-(uint)(fVar32 < fVar45) & 0x3f800000)) & uVar10
            ;
            auVar61._8_4_ = (uint)(fVar44 - (float)(-(uint)(fVar24 < fVar44) & 0x3f800000)) & uVar11
            ;
            auVar61._12_4_ =
                 (uint)(fVar46 - (float)(-(uint)(fVar43 < fVar46) & 0x3f800000)) & uVar12;
            auVar38._0_4_ = ~uVar9 & (uint)fVar13;
            auVar38._4_4_ = ~uVar10 & (uint)fVar32;
            auVar38._8_4_ = ~uVar11 & (uint)fVar24;
            auVar38._12_4_ = ~uVar12 & (uint)fVar43;
            *pauVar7 = auVar38 | auVar61;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = floorf(*(float *)(*pauVar7 + lVar8 * 4));
            *(float *)(*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 3:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar64 = *pauVar7;
            fVar13 = auVar64._0_4_;
            fVar32 = auVar64._4_4_;
            fVar24 = auVar64._8_4_;
            fVar43 = auVar64._12_4_;
            uVar9 = -(uint)(ABS(fVar13) <= 8388608.0);
            uVar10 = -(uint)(ABS(fVar32) <= 8388608.0);
            uVar11 = -(uint)(ABS(fVar24) <= 8388608.0);
            uVar12 = -(uint)(ABS(fVar43) <= 8388608.0);
            fVar31 = (float)((uint)(float)(int)ABS(fVar13) | (uint)fVar13 & 0x80000000);
            fVar45 = (float)((uint)(float)(int)ABS(fVar32) | (uint)fVar32 & 0x80000000);
            fVar44 = (float)((uint)(float)(int)ABS(fVar24) | (uint)fVar24 & 0x80000000);
            fVar46 = (float)((uint)(float)(int)ABS(fVar43) | (uint)fVar43 & 0x80000000);
            auVar62._0_4_ =
                 (uint)(fVar31 - (float)(-(uint)(fVar31 < fVar13 && 0.0 < fVar13) & 0xbf800000)) &
                 uVar9;
            auVar62._4_4_ =
                 (uint)(fVar45 - (float)(-(uint)(fVar45 < fVar32 && 0.0 < fVar32) & 0xbf800000)) &
                 uVar10;
            auVar62._8_4_ =
                 (uint)(fVar44 - (float)(-(uint)(fVar44 < fVar24 && 0.0 < fVar24) & 0xbf800000)) &
                 uVar11;
            auVar62._12_4_ =
                 (uint)(fVar46 - (float)(-(uint)(fVar46 < fVar43 && 0.0 < fVar43) & 0xbf800000)) &
                 uVar12;
            auVar39._0_4_ = ~uVar9 & (uint)fVar13;
            auVar39._4_4_ = ~uVar10 & (uint)fVar32;
            auVar39._8_4_ = ~uVar11 & (uint)fVar24;
            auVar39._12_4_ = ~uVar12 & (uint)fVar43;
            *pauVar7 = auVar39 | auVar62;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = ceilf(*(float *)(*pauVar7 + lVar8 * 4));
            *(float *)(*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 4:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar13 = *(float *)((long)*pauVar7 + 4);
            fVar32 = *(float *)((long)*pauVar7 + 8);
            fVar24 = *(float *)((long)*pauVar7 + 0xc);
            auVar16._0_4_ = *(float *)*pauVar7 * *(float *)*pauVar7;
            auVar16._4_4_ = fVar13 * fVar13;
            auVar16._8_4_ = fVar32 * fVar32;
            auVar16._12_4_ = fVar24 * fVar24;
            *pauVar7 = auVar16;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = *(float *)((long)*pauVar7 + lVar8 * 4);
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar13 * fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 5:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            in_XMM0 = sqrtps(in_XMM0,*pauVar7);
            *pauVar7 = in_XMM0;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            in_XMM0 = ZEXT416((uint)SQRT(*(float *)(*pauVar7 + lVar8 * 4)));
            *(float *)(*pauVar7 + lVar8 * 4) = SQRT(*(float *)(*pauVar7 + lVar8 * 4));
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 6:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            in_XMM1 = rsqrtps(in_XMM1,*pauVar7);
            *pauVar7 = in_XMM1;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            in_XMM1 = ZEXT416((uint)SQRT(*(float *)(*pauVar7 + lVar8 * 4)));
            *(float *)(*pauVar7 + lVar8 * 4) = 1.0 / SQRT(*(float *)(*pauVar7 + lVar8 * 4));
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 7:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        auVar51 = _DAT_005a80f0;
        auVar64 = _DAT_005a80e0;
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar48 = minps(*pauVar7,auVar64);
            auVar48 = maxps(auVar48,auVar51);
            fVar32 = auVar48._0_4_ * 1.442695 + 0.5;
            fVar43 = auVar48._4_4_ * 1.442695 + 0.5;
            fVar45 = auVar48._8_4_ * 1.442695 + 0.5;
            fVar46 = auVar48._12_4_ * 1.442695 + 0.5;
            fVar13 = (float)(int)fVar32;
            fVar24 = (float)(int)fVar43;
            fVar31 = (float)(int)fVar45;
            fVar44 = (float)(int)fVar46;
            fVar13 = fVar13 - (float)(-(uint)(fVar32 < fVar13) & 0x3f800000);
            fVar24 = fVar24 - (float)(-(uint)(fVar43 < fVar24) & 0x3f800000);
            fVar31 = fVar31 - (float)(-(uint)(fVar45 < fVar31) & 0x3f800000);
            fVar44 = fVar44 - (float)(-(uint)(fVar46 < fVar44) & 0x3f800000);
            fVar32 = fVar13 * -0.6931472 + auVar48._0_4_;
            fVar43 = fVar24 * -0.6931472 + auVar48._4_4_;
            fVar45 = fVar31 * -0.6931472 + auVar48._8_4_;
            fVar46 = fVar44 * -0.6931472 + auVar48._12_4_;
            auVar52._0_4_ =
                 (float)((int)fVar13 * 0x800000 + 0x3f800000) *
                 (fVar32 + 1.0 +
                 (((((fVar32 * 0.00019875691 + 0.0013981999) * fVar32 + 0.008333452) * fVar32 +
                   0.041665796) * fVar32 + 0.16666666) * fVar32 + 0.5) * fVar32 * fVar32);
            auVar52._4_4_ =
                 (float)((int)fVar24 * 0x800000 + 0x3f800000) *
                 (fVar43 + 1.0 +
                 (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43 +
                   0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5) * fVar43 * fVar43);
            auVar52._8_4_ =
                 (float)((int)fVar31 * 0x800000 + 0x3f800000) *
                 (fVar45 + 1.0 +
                 (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                   0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45);
            auVar52._12_4_ =
                 (float)((int)fVar44 * 0x800000 + 0x3f800000) *
                 (fVar46 + 1.0 +
                 (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                   0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46);
            *pauVar7 = auVar52;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = expf(*(float *)(*pauVar7 + lVar8 * 4));
            *(float *)(*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 8:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        auVar64 = _DAT_005a8190;
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar51 = *pauVar7;
            auVar48 = maxps(auVar51,auVar64);
            fVar13 = (float)(auVar48._0_4_ & 0x807fffff | 0x3f000000);
            fVar24 = (float)(auVar48._4_4_ & 0x807fffff | 0x3f000000);
            fVar31 = (float)(auVar48._8_4_ & 0x807fffff | 0x3f000000);
            fVar44 = (float)(auVar48._12_4_ & 0x807fffff | 0x3f000000);
            fVar32 = fVar13 + -1.0 + (float)(-(uint)(fVar13 < 0.70710677) & (uint)fVar13);
            fVar43 = fVar24 + -1.0 + (float)(-(uint)(fVar24 < 0.70710677) & (uint)fVar24);
            fVar45 = fVar31 + -1.0 + (float)(-(uint)(fVar31 < 0.70710677) & (uint)fVar31);
            fVar46 = fVar44 + -1.0 + (float)(-(uint)(fVar44 < 0.70710677) & (uint)fVar44);
            auVar57._0_4_ =
                 ((float)(int)((auVar48._0_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar13 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar32 +
                 (((((((((fVar32 * 0.070376836 + -0.1151461) * fVar32 + 0.116769984) * fVar32 +
                       -0.12420141) * fVar32 + 0.14249323) * fVar32 + -0.16668057) * fVar32 +
                    0.20000714) * fVar32 + -0.24999994) * fVar32 + 0.3333333) * fVar32 + -0.5) *
                 fVar32 * fVar32;
            auVar57._4_4_ =
                 ((float)(int)((auVar48._4_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar24 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar43 +
                 (((((((((fVar43 * 0.070376836 + -0.1151461) * fVar43 + 0.116769984) * fVar43 +
                       -0.12420141) * fVar43 + 0.14249323) * fVar43 + -0.16668057) * fVar43 +
                    0.20000714) * fVar43 + -0.24999994) * fVar43 + 0.3333333) * fVar43 + -0.5) *
                 fVar43 * fVar43;
            auVar57._8_4_ =
                 ((float)(int)((auVar48._8_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar31 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar45 +
                 (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 + 0.116769984) * fVar45 +
                       -0.12420141) * fVar45 + 0.14249323) * fVar45 + -0.16668057) * fVar45 +
                    0.20000714) * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 + -0.5) *
                 fVar45 * fVar45;
            auVar57._12_4_ =
                 ((float)(int)((auVar48._12_4_ >> 0x17) - 0x7e) -
                 (float)(-(uint)(fVar44 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar46 +
                 (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) * fVar46 +
                       -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057) * fVar46 +
                    0.20000714) * fVar46 + -0.24999994) * fVar46 + 0.3333333) * fVar46 + -0.5) *
                 fVar46 * fVar46;
            auVar22._4_4_ = -(uint)(auVar51._4_4_ <= 0.0);
            auVar22._0_4_ = -(uint)(auVar51._0_4_ <= 0.0);
            auVar22._8_4_ = -(uint)(auVar51._8_4_ <= 0.0);
            auVar22._12_4_ = -(uint)(auVar51._12_4_ <= 0.0);
            *pauVar7 = auVar57 | auVar22;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = logf(*(float *)(*pauVar7 + lVar8 * 4));
            *(float *)(*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 9:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar13 = *(float *)((long)*pauVar7 + 4);
            fVar32 = *(float *)((long)*pauVar7 + 8);
            fVar24 = *(float *)((long)*pauVar7 + 0xc);
            fVar43 = ABS(*(float *)*pauVar7);
            fVar31 = ABS(fVar13);
            fVar45 = ABS(fVar32);
            fVar44 = ABS(fVar24);
            uVar9 = (int)(fVar43 * 1.2732395) + 1;
            uVar11 = (int)(fVar31 * 1.2732395) + 1;
            uVar26 = (int)(fVar45 * 1.2732395) + 1;
            uVar29 = (int)(fVar44 * 1.2732395) + 1;
            fVar43 = (float)(int)(uVar9 & 0xfffffffe) * -0.7853982 + fVar43;
            fVar31 = (float)(int)(uVar11 & 0xfffffffe) * -0.7853982 + fVar31;
            fVar45 = (float)(int)(uVar26 & 0xfffffffe) * -0.7853982 + fVar45;
            fVar44 = (float)(int)(uVar29 & 0xfffffffe) * -0.7853982 + fVar44;
            fVar46 = fVar43 * fVar43;
            fVar70 = fVar31 * fVar31;
            fVar71 = fVar45 * fVar45;
            fVar72 = fVar44 * fVar44;
            uVar10 = -(uint)((uVar9 & 2) == 0);
            uVar12 = -(uint)((uVar11 & 2) == 0);
            uVar27 = -(uint)((uVar26 & 2) == 0);
            uVar30 = -(uint)((uVar29 & 2) == 0);
            auVar60._0_4_ =
                 (uint)(fVar46 * fVar43 *
                        ((fVar46 * -0.00019515296 + 0.008332161) * fVar46 + -0.16666655) + fVar43) &
                 uVar10;
            auVar60._4_4_ =
                 (uint)(fVar70 * fVar31 *
                        ((fVar70 * -0.00019515296 + 0.008332161) * fVar70 + -0.16666655) + fVar31) &
                 uVar12;
            auVar60._8_4_ =
                 (uint)(fVar71 * fVar45 *
                        ((fVar71 * -0.00019515296 + 0.008332161) * fVar71 + -0.16666655) + fVar45) &
                 uVar27;
            auVar60._12_4_ =
                 (uint)(fVar72 * fVar44 *
                        ((fVar72 * -0.00019515296 + 0.008332161) * fVar72 + -0.16666655) + fVar44) &
                 uVar30;
            auVar18._0_4_ =
                 ~uVar10 & (uint)((((fVar46 * 2.4433157e-05 + -0.0013887316) * fVar46 + 0.041666646)
                                   * fVar46 + -0.5) * fVar46 + 1.0);
            auVar18._4_4_ =
                 ~uVar12 & (uint)((((fVar70 * 2.4433157e-05 + -0.0013887316) * fVar70 + 0.041666646)
                                   * fVar70 + -0.5) * fVar70 + 1.0);
            auVar18._8_4_ =
                 ~uVar27 & (uint)((((fVar71 * 2.4433157e-05 + -0.0013887316) * fVar71 + 0.041666646)
                                   * fVar71 + -0.5) * fVar71 + 1.0);
            auVar18._12_4_ =
                 ~uVar30 & (uint)((((fVar72 * 2.4433157e-05 + -0.0013887316) * fVar72 + 0.041666646)
                                   * fVar72 + -0.5) * fVar72 + 1.0);
            auVar18 = auVar18 | auVar60;
            auVar19._0_4_ =
                 auVar18._0_4_ ^ (uVar9 * 0x20000000 ^ (uint)*(float *)*pauVar7) & 0x80000000;
            auVar19._4_4_ = auVar18._4_4_ ^ (uVar11 * 0x20000000 ^ (uint)fVar13) & 0x80000000;
            auVar19._8_4_ = auVar18._8_4_ ^ (uVar26 * 0x20000000 ^ (uint)fVar32) & 0x80000000;
            auVar19._12_4_ = auVar18._12_4_ ^ (uVar29 * 0x20000000 ^ (uint)fVar24) & 0x80000000;
            *pauVar7 = auVar19;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = sinf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 10:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar32 = ABS(*(float *)((long)*pauVar7 + 4));
            fVar24 = ABS(*(float *)((long)*pauVar7 + 8));
            fVar43 = ABS(*(float *)((long)*pauVar7 + 0xc));
            uVar9 = (int)(ABS(*(float *)*pauVar7) * 1.2732395) + 1U & 0xfffffffe;
            uVar11 = (int)(fVar32 * 1.2732395) + 1U & 0xfffffffe;
            uVar26 = (int)(fVar24 * 1.2732395) + 1U & 0xfffffffe;
            uVar29 = (int)(fVar43 * 1.2732395) + 1U & 0xfffffffe;
            fVar13 = (float)(int)uVar9 * -0.7853982 + ABS(*(float *)*pauVar7);
            fVar32 = (float)(int)uVar11 * -0.7853982 + fVar32;
            fVar24 = (float)(int)uVar26 * -0.7853982 + fVar24;
            fVar43 = (float)(int)uVar29 * -0.7853982 + fVar43;
            fVar31 = fVar13 * fVar13;
            fVar45 = fVar32 * fVar32;
            fVar44 = fVar24 * fVar24;
            fVar46 = fVar43 * fVar43;
            uVar9 = uVar9 - 2;
            uVar11 = uVar11 - 2;
            uVar26 = uVar26 - 2;
            uVar29 = uVar29 - 2;
            uVar10 = -(uint)((uVar9 & 2) == 0);
            uVar12 = -(uint)((uVar11 & 2) == 0);
            uVar27 = -(uint)((uVar26 & 2) == 0);
            uVar30 = -(uint)((uVar29 & 2) == 0);
            auVar56._0_4_ =
                 (uint)(fVar31 * fVar13 *
                        ((fVar31 * -0.00019515296 + 0.008332161) * fVar31 + -0.16666655) + fVar13) &
                 uVar10;
            auVar56._4_4_ =
                 (uint)(fVar45 * fVar32 *
                        ((fVar45 * -0.00019515296 + 0.008332161) * fVar45 + -0.16666655) + fVar32) &
                 uVar12;
            auVar56._8_4_ =
                 (uint)(fVar44 * fVar24 *
                        ((fVar44 * -0.00019515296 + 0.008332161) * fVar44 + -0.16666655) + fVar24) &
                 uVar27;
            auVar56._12_4_ =
                 (uint)(fVar46 * fVar43 *
                        ((fVar46 * -0.00019515296 + 0.008332161) * fVar46 + -0.16666655) + fVar43) &
                 uVar30;
            auVar21._0_4_ =
                 ~uVar10 & (uint)((((fVar31 * 2.4433157e-05 + -0.0013887316) * fVar31 + 0.041666646)
                                   * fVar31 + -0.5) * fVar31 + 1.0);
            auVar21._4_4_ =
                 ~uVar12 & (uint)((((fVar45 * 2.4433157e-05 + -0.0013887316) * fVar45 + 0.041666646)
                                   * fVar45 + -0.5) * fVar45 + 1.0);
            auVar21._8_4_ =
                 ~uVar27 & (uint)((((fVar44 * 2.4433157e-05 + -0.0013887316) * fVar44 + 0.041666646)
                                   * fVar44 + -0.5) * fVar44 + 1.0);
            auVar21._12_4_ =
                 ~uVar30 & (uint)((((fVar46 * 2.4433157e-05 + -0.0013887316) * fVar46 + 0.041666646)
                                   * fVar46 + -0.5) * fVar46 + 1.0);
            auVar42._0_4_ = uVar9 * 0x20000000;
            auVar42._4_4_ = uVar11 * 0x20000000;
            auVar42._8_4_ = uVar26 * 0x20000000;
            auVar42._12_4_ = uVar29 * 0x20000000;
            *pauVar7 = auVar42 & _DAT_005a3050 ^ _DAT_005a3050 ^ (auVar21 | auVar56);
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = cosf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 0xb:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        auVar64 = _DAT_005a3050;
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar51 = *pauVar7;
            iVar2 = (int)(ABS(auVar51._0_4_) * 1.2732395);
            iVar23 = (int)(ABS(auVar51._4_4_) * 1.2732395);
            iVar25 = (int)(ABS(auVar51._8_4_) * 1.2732395);
            iVar28 = (int)(ABS(auVar51._12_4_) * 1.2732395);
            uVar9 = iVar2 + 1;
            uVar10 = iVar23 + 1;
            uVar11 = iVar25 + 1;
            uVar12 = iVar28 + 1;
            auVar50._0_4_ = uVar9 * 0x20000000;
            auVar50._4_4_ = uVar10 * 0x20000000;
            auVar50._8_4_ = uVar11 * 0x20000000;
            auVar50._12_4_ = uVar12 * 0x20000000;
            auVar36._0_4_ = -(uint)((uVar9 & 2) == 0);
            auVar36._4_4_ = -(uint)((uVar10 & 2) == 0);
            auVar36._8_4_ = -(uint)((uVar11 & 2) == 0);
            auVar36._12_4_ = -(uint)((uVar12 & 2) == 0);
            fVar13 = (float)(int)(uVar9 & 0xfffffffe) * -0.7853982 + ABS(auVar51._0_4_);
            fVar32 = (float)(int)(uVar10 & 0xfffffffe) * -0.7853982 + ABS(auVar51._4_4_);
            fVar24 = (float)(int)(uVar11 & 0xfffffffe) * -0.7853982 + ABS(auVar51._8_4_);
            fVar43 = (float)(int)(uVar12 & 0xfffffffe) * -0.7853982 + ABS(auVar51._12_4_);
            fVar31 = fVar13 * fVar13;
            fVar45 = fVar32 * fVar32;
            fVar44 = fVar24 * fVar24;
            fVar46 = fVar43 * fVar43;
            auVar73._0_4_ =
                 fVar31 * -0.5 +
                 fVar31 * fVar31 * ((fVar31 * 2.4433157e-05 + -0.0013887316) * fVar31 + 0.041666646)
                 + 1.0;
            auVar73._4_4_ =
                 fVar45 * -0.5 +
                 fVar45 * fVar45 * ((fVar45 * 2.4433157e-05 + -0.0013887316) * fVar45 + 0.041666646)
                 + 1.0;
            auVar73._8_4_ =
                 fVar44 * -0.5 +
                 fVar44 * fVar44 * ((fVar44 * 2.4433157e-05 + -0.0013887316) * fVar44 + 0.041666646)
                 + 1.0;
            auVar73._12_4_ =
                 fVar46 * -0.5 +
                 fVar46 * fVar46 * ((fVar46 * 2.4433157e-05 + -0.0013887316) * fVar46 + 0.041666646)
                 + 1.0;
            auVar67._0_4_ =
                 fVar31 * fVar13 * ((fVar31 * -0.00019515296 + 0.008332161) * fVar31 + -0.16666655)
                 + fVar13;
            auVar67._4_4_ =
                 fVar45 * fVar32 * ((fVar45 * -0.00019515296 + 0.008332161) * fVar45 + -0.16666655)
                 + fVar32;
            auVar67._8_4_ =
                 fVar44 * fVar24 * ((fVar44 * -0.00019515296 + 0.008332161) * fVar44 + -0.16666655)
                 + fVar24;
            auVar67._12_4_ =
                 fVar46 * fVar43 * ((fVar46 * -0.00019515296 + 0.008332161) * fVar46 + -0.16666655)
                 + fVar43;
            auVar15._0_4_ = iVar2 * 0x20000000 + -0x20000000;
            auVar15._4_4_ = iVar23 * 0x20000000 + -0x20000000;
            auVar15._8_4_ = iVar25 * 0x20000000 + -0x20000000;
            auVar15._12_4_ = iVar28 * 0x20000000 + -0x20000000;
            auVar48 = auVar15 & auVar64 ^ (auVar73 & auVar36 | ~auVar36 & auVar67);
            auVar41 = auVar48 ^ auVar64;
            auVar37._0_4_ = (float)(-(uint)(auVar41._0_4_ == 0.0) & 0x322bcc77) - auVar48._0_4_;
            auVar37._4_4_ = (float)(-(uint)(auVar41._4_4_ == 0.0) & 0x322bcc77) - auVar48._4_4_;
            auVar37._8_4_ = (float)(-(uint)(auVar41._8_4_ == 0.0) & 0x322bcc77) - auVar48._8_4_;
            auVar37._12_4_ = (float)(-(uint)(auVar41._12_4_ == 0.0) & 0x322bcc77) - auVar48._12_4_;
            auVar51 = divps((~auVar36 & auVar73 | auVar67 & auVar36) ^ (auVar50 ^ auVar51) & auVar64
                            ,auVar37);
            *pauVar7 = auVar51;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = tanf(*(float *)(*pauVar7 + lVar8 * 4));
            *(float *)(*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 0xc:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar13 = *(float *)((long)*pauVar7 + 8);
            fVar32 = *(float *)((long)*pauVar7 + 0xc);
            fVar24 = ABS(*(float *)*pauVar7);
            fVar43 = ABS(*(float *)((long)*pauVar7 + 4));
            fVar45 = ABS(fVar13);
            fVar46 = ABS(fVar32);
            uVar9 = -(uint)(0.5 < fVar24);
            uVar10 = -(uint)(0.5 < fVar43);
            uVar11 = -(uint)(0.5 < fVar45);
            uVar12 = -(uint)(0.5 < fVar46);
            auVar68._0_4_ = fVar24 * 0.5;
            auVar68._4_4_ = fVar43 * 0.5;
            auVar68._8_4_ = fVar45 * 0.5;
            auVar68._12_4_ = fVar46 * 0.5;
            auVar74._0_4_ = 0.5 - auVar68._0_4_;
            auVar74._4_4_ = 0.5 - auVar68._4_4_;
            auVar74._8_4_ = 0.5 - auVar68._8_4_;
            auVar74._12_4_ = 0.5 - auVar68._12_4_;
            auVar64 = sqrtps(auVar68,auVar74);
            fVar24 = (float)(~uVar9 & (uint)fVar24 | auVar64._0_4_ & uVar9);
            fVar31 = (float)(~uVar10 & (uint)fVar43 | auVar64._4_4_ & uVar10);
            fVar44 = (float)(~uVar11 & (uint)fVar45 | auVar64._8_4_ & uVar11);
            fVar70 = (float)(~uVar12 & (uint)fVar46 | auVar64._12_4_ & uVar12);
            fVar43 = fVar24 * fVar24;
            fVar45 = fVar31 * fVar31;
            fVar46 = fVar44 * fVar44;
            fVar71 = fVar70 * fVar70;
            fVar72 = fVar43 * fVar43;
            fVar75 = fVar45 * fVar45;
            fVar76 = fVar46 * fVar46;
            fVar77 = fVar71 * fVar71;
            auVar59._0_4_ =
                 ((float)(uVar9 & 0x3f800000) * -3.0 + 1.0) * fVar24 *
                 (((fVar72 * 0.042417344 + 0.045520633) * fVar72 + 0.16666782) * fVar43 +
                 (fVar72 * 0.023994016 + 0.07494697) * fVar72 + 1.0) +
                 (float)(uVar9 & 0x3f800000) * 1.5707964;
            auVar59._4_4_ =
                 ((float)(uVar10 & 0x3f800000) * -3.0 + 1.0) * fVar31 *
                 (((fVar75 * 0.042417344 + 0.045520633) * fVar75 + 0.16666782) * fVar45 +
                 (fVar75 * 0.023994016 + 0.07494697) * fVar75 + 1.0) +
                 (float)(uVar10 & 0x3f800000) * 1.5707964;
            auVar59._8_4_ =
                 ((float)(uVar11 & 0x3f800000) * -3.0 + 1.0) * fVar44 *
                 (((fVar76 * 0.042417344 + 0.045520633) * fVar76 + 0.16666782) * fVar46 +
                 (fVar76 * 0.023994016 + 0.07494697) * fVar76 + 1.0) +
                 (float)(uVar11 & 0x3f800000) * 1.5707964;
            auVar59._12_4_ =
                 ((float)(uVar12 & 0x3f800000) * -3.0 + 1.0) * fVar70 *
                 (((fVar77 * 0.042417344 + 0.045520633) * fVar77 + 0.16666782) * fVar71 +
                 (fVar77 * 0.023994016 + 0.07494697) * fVar77 + 1.0) +
                 (float)(uVar12 & 0x3f800000) * 1.5707964;
            auVar17._0_8_ = *(ulong *)*pauVar7 & 0x8000000080000000;
            auVar17._8_4_ = (uint)fVar13 & 0x80000000;
            auVar17._12_4_ = (uint)fVar32 & 0x80000000;
            *pauVar7 = auVar59 | auVar17;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = asinf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 0xd:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar13 = *(float *)((long)*pauVar7 + 4);
            fVar32 = *(float *)((long)*pauVar7 + 8);
            fVar24 = *(float *)((long)*pauVar7 + 0xc);
            fVar43 = ABS(*(float *)*pauVar7);
            fVar31 = ABS(fVar13);
            fVar45 = ABS(fVar32);
            fVar44 = ABS(fVar24);
            uVar9 = -(uint)(0.5 < fVar43);
            uVar10 = -(uint)(0.5 < fVar31);
            uVar11 = -(uint)(0.5 < fVar45);
            uVar12 = -(uint)(0.5 < fVar44);
            auVar63._0_4_ = 0.5 - fVar43 * 0.5;
            auVar63._4_4_ = 0.5 - fVar31 * 0.5;
            auVar63._8_4_ = 0.5 - fVar45 * 0.5;
            auVar63._12_4_ = 0.5 - fVar44 * 0.5;
            auVar64 = sqrtps(auVar63,auVar63);
            fVar43 = (float)(auVar64._0_4_ & uVar9 | ~uVar9 & (uint)fVar43);
            fVar31 = (float)(auVar64._4_4_ & uVar10 | ~uVar10 & (uint)fVar31);
            fVar45 = (float)(auVar64._8_4_ & uVar11 | ~uVar11 & (uint)fVar45);
            fVar44 = (float)(auVar64._12_4_ & uVar12 | ~uVar12 & (uint)fVar44);
            fVar46 = fVar43 * fVar43;
            fVar70 = fVar31 * fVar31;
            fVar71 = fVar45 * fVar45;
            fVar72 = fVar44 * fVar44;
            fVar75 = fVar46 * fVar46;
            fVar76 = fVar70 * fVar70;
            fVar77 = fVar71 * fVar71;
            fVar78 = fVar72 * fVar72;
            auVar69._0_8_ = *(ulong *)*pauVar7 & 0x8000000080000000;
            auVar69._8_4_ = (uint)fVar32 & 0x80000000;
            auVar69._12_4_ = (uint)fVar24 & 0x80000000;
            auVar53._0_4_ =
                 (((fVar75 * 0.042417344 + 0.045520633) * fVar75 + 0.16666782) * fVar46 +
                 (fVar75 * 0.023994016 + 0.07494697) * fVar75 + 1.0) * fVar43;
            auVar53._4_4_ =
                 (((fVar76 * 0.042417344 + 0.045520633) * fVar76 + 0.16666782) * fVar70 +
                 (fVar76 * 0.023994016 + 0.07494697) * fVar76 + 1.0) * fVar31;
            auVar53._8_4_ =
                 (((fVar77 * 0.042417344 + 0.045520633) * fVar77 + 0.16666782) * fVar71 +
                 (fVar77 * 0.023994016 + 0.07494697) * fVar77 + 1.0) * fVar45;
            auVar53._12_4_ =
                 (((fVar78 * 0.042417344 + 0.045520633) * fVar78 + 0.16666782) * fVar72 +
                 (fVar78 * 0.023994016 + 0.07494697) * fVar78 + 1.0) * fVar44;
            auVar65._8_4_ = auVar69._8_4_;
            auVar65._0_8_ = auVar69._0_8_;
            auVar65._12_4_ = auVar69._12_4_;
            auVar65 = auVar65 | auVar53;
            auVar54._0_4_ = auVar53._0_4_ + auVar53._0_4_;
            auVar54._4_4_ = auVar53._4_4_ + auVar53._4_4_;
            auVar54._8_4_ = auVar53._8_4_ + auVar53._8_4_;
            auVar54._12_4_ = auVar53._12_4_ + auVar53._12_4_;
            auVar54 = auVar54 | auVar69;
            auVar55._0_4_ =
                 (uint)(auVar54._0_4_ + (float)(-(uint)(*(float *)*pauVar7 < 0.0) & 0x40490fdb)) &
                 uVar9;
            auVar55._4_4_ =
                 (uint)(auVar54._4_4_ + (float)(-(uint)(fVar13 < 0.0) & 0x40490fdb)) & uVar10;
            auVar55._8_4_ =
                 (uint)(auVar54._8_4_ + (float)(-(uint)(fVar32 < 0.0) & 0x40490fdb)) & uVar11;
            auVar55._12_4_ =
                 (uint)(auVar54._12_4_ + (float)(-(uint)(fVar24 < 0.0) & 0x40490fdb)) & uVar12;
            auVar20._0_4_ = ~uVar9 & (uint)(1.5707964 - auVar65._0_4_);
            auVar20._4_4_ = ~uVar10 & (uint)(1.5707964 - auVar65._4_4_);
            auVar20._8_4_ = ~uVar11 & (uint)(1.5707964 - auVar65._8_4_);
            auVar20._12_4_ = ~uVar12 & (uint)(1.5707964 - auVar65._12_4_);
            *pauVar7 = auVar20 | auVar55;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = acosf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 0xe:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        auVar64 = _DAT_005a8120;
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            fVar13 = *(float *)((long)*pauVar7 + 8);
            fVar32 = *(float *)((long)*pauVar7 + 0xc);
            fVar24 = ABS(*(float *)((long)*pauVar7 + 4));
            auVar58._0_8_ = *(ulong *)*pauVar7 & 0x7fffffff7fffffff;
            auVar58._8_4_ = ABS(fVar13);
            auVar58._12_4_ = ABS(fVar32);
            uVar9 = -(uint)(auVar64._0_4_ < ABS(*(float *)*pauVar7));
            uVar10 = -(uint)(auVar64._4_4_ < fVar24);
            uVar11 = -(uint)(auVar64._8_4_ < auVar58._8_4_);
            uVar12 = -(uint)(auVar64._12_4_ < auVar58._12_4_);
            auVar66._0_4_ = ~uVar9 & (uint)ABS(*(float *)*pauVar7);
            auVar66._4_4_ = ~uVar10 & (uint)fVar24;
            auVar66._8_4_ = ~uVar11 & (uint)auVar58._8_4_;
            auVar66._12_4_ = ~uVar12 & (uint)auVar58._12_4_;
            auVar49._0_8_ = CONCAT44(uVar10,uVar9) & 0xbf800000bf800000;
            auVar49._8_4_ = uVar11 & 0xbf800000;
            auVar49._12_4_ = uVar12 & 0xbf800000;
            auVar51 = maxps(auVar58,auVar64);
            auVar51 = divps(auVar49 | auVar66,auVar51);
            fVar24 = auVar51._0_4_;
            fVar43 = auVar51._4_4_;
            fVar31 = auVar51._8_4_;
            fVar45 = auVar51._12_4_;
            fVar44 = fVar24 * fVar24;
            fVar46 = fVar43 * fVar43;
            fVar70 = fVar31 * fVar31;
            fVar71 = fVar45 * fVar45;
            fVar72 = fVar44 * fVar44;
            fVar75 = fVar46 * fVar46;
            fVar76 = fVar70 * fVar70;
            fVar77 = fVar71 * fVar71;
            auVar35._0_4_ =
                 (float)(uVar9 & 0x3fc90fdb) +
                 ((((fVar72 * -0.01606863 + -0.07504295) * fVar72 + -0.14203644) * fVar72 +
                  -0.33333072) * fVar44 +
                 (((fVar72 * 0.0028498897 + 0.04269152) * fVar72 + 0.10640934) * fVar72 + 0.1999262)
                 * fVar72 + auVar64._0_4_) * fVar24;
            auVar35._4_4_ =
                 (float)(uVar10 & 0x3fc90fdb) +
                 ((((fVar75 * -0.01606863 + -0.07504295) * fVar75 + -0.14203644) * fVar75 +
                  -0.33333072) * fVar46 +
                 (((fVar75 * 0.0028498897 + 0.04269152) * fVar75 + 0.10640934) * fVar75 + 0.1999262)
                 * fVar75 + auVar64._4_4_) * fVar43;
            auVar35._8_4_ =
                 (float)(uVar11 & 0x3fc90fdb) +
                 ((((fVar76 * -0.01606863 + -0.07504295) * fVar76 + -0.14203644) * fVar76 +
                  -0.33333072) * fVar70 +
                 (((fVar76 * 0.0028498897 + 0.04269152) * fVar76 + 0.10640934) * fVar76 + 0.1999262)
                 * fVar76 + auVar64._8_4_) * fVar31;
            auVar35._12_4_ =
                 (float)(uVar12 & 0x3fc90fdb) +
                 ((((fVar77 * -0.01606863 + -0.07504295) * fVar77 + -0.14203644) * fVar77 +
                  -0.33333072) * fVar71 +
                 (((fVar77 * 0.0028498897 + 0.04269152) * fVar77 + 0.10640934) * fVar77 + 0.1999262)
                 * fVar77 + auVar64._12_4_) * fVar45;
            auVar14._0_8_ = *(ulong *)*pauVar7 & 0x8000000080000000;
            auVar14._8_4_ = (uint)fVar13 & 0x80000000;
            auVar14._12_4_ = (uint)fVar32 & 0x80000000;
            *pauVar7 = auVar35 | auVar14;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = atanf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 0xf:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar51 = divps(auVar64,*pauVar7);
            *pauVar7 = auVar51;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            *(float *)(*pauVar7 + lVar8 * 4) = 1.0 / *(float *)(*pauVar7 + lVar8 * 4);
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 0x10:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        auVar51 = _DAT_005a80f0;
        auVar64 = _DAT_005a80e0;
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar47._0_4_ = *(float *)*pauVar7 * -2.0;
            auVar47._4_4_ = *(float *)((long)*pauVar7 + 4) * -2.0;
            auVar47._8_4_ = *(float *)((long)*pauVar7 + 8) * -2.0;
            auVar47._12_4_ = *(float *)((long)*pauVar7 + 0xc) * -2.0;
            auVar48 = minps(auVar47,auVar64);
            auVar48 = maxps(auVar48,auVar51);
            fVar31 = auVar48._0_4_ * 1.442695 + 0.5;
            fVar45 = auVar48._4_4_ * 1.442695 + 0.5;
            fVar44 = auVar48._8_4_ * 1.442695 + 0.5;
            fVar46 = auVar48._12_4_ * 1.442695 + 0.5;
            fVar13 = (float)(int)fVar31;
            fVar32 = (float)(int)fVar45;
            fVar24 = (float)(int)fVar44;
            fVar43 = (float)(int)fVar46;
            fVar13 = fVar13 - (float)(-(uint)(fVar31 < fVar13) & 0x3f800000);
            fVar32 = fVar32 - (float)(-(uint)(fVar45 < fVar32) & 0x3f800000);
            fVar24 = fVar24 - (float)(-(uint)(fVar44 < fVar24) & 0x3f800000);
            fVar43 = fVar43 - (float)(-(uint)(fVar46 < fVar43) & 0x3f800000);
            fVar31 = fVar13 * -0.6931472 + auVar48._0_4_;
            fVar45 = fVar32 * -0.6931472 + auVar48._4_4_;
            fVar44 = fVar24 * -0.6931472 + auVar48._8_4_;
            fVar46 = fVar43 * -0.6931472 + auVar48._12_4_;
            auVar41._0_4_ =
                 (float)((int)fVar13 * 0x800000 + 0x3f800000) *
                 (fVar31 + 1.0 +
                 (((((fVar31 * 0.00019875691 + 0.0013981999) * fVar31 + 0.008333452) * fVar31 +
                   0.041665796) * fVar31 + 0.16666666) * fVar31 + 0.5) * fVar31 * fVar31) + 1.0;
            auVar41._4_4_ =
                 (float)((int)fVar32 * 0x800000 + 0x3f800000) *
                 (fVar45 + 1.0 +
                 (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                   0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + 1.0;
            auVar41._8_4_ =
                 (float)((int)fVar24 * 0x800000 + 0x3f800000) *
                 (fVar44 + 1.0 +
                 (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44 +
                   0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5) * fVar44 * fVar44) + 1.0;
            auVar41._12_4_ =
                 (float)((int)fVar43 * 0x800000 + 0x3f800000) *
                 (fVar46 + 1.0 +
                 (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                   0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + 1.0;
            auVar48 = divps(_DAT_005a8da0,auVar41);
            auVar34._0_4_ = auVar48._0_4_ + -1.0;
            auVar34._4_4_ = auVar48._4_4_ + -1.0;
            auVar34._8_4_ = auVar48._8_4_ + -1.0;
            auVar34._12_4_ = auVar48._12_4_ + -1.0;
            *pauVar7 = auVar34;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = tanhf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 0x11:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        auVar64 = _DAT_005a8190;
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar51 = *pauVar7;
            auVar41 = maxps(auVar51,auVar64);
            fVar13 = (float)(auVar41._0_4_ & 0x807fffff | 0x3f000000);
            fVar24 = (float)(auVar41._4_4_ & 0x807fffff | 0x3f000000);
            fVar31 = (float)(auVar41._8_4_ & 0x807fffff | 0x3f000000);
            fVar44 = (float)(auVar41._12_4_ & 0x807fffff | 0x3f000000);
            fVar32 = fVar13 + -1.0 + (float)(-(uint)(fVar13 < 0.70710677) & (uint)fVar13);
            fVar43 = fVar24 + -1.0 + (float)(-(uint)(fVar24 < 0.70710677) & (uint)fVar24);
            fVar45 = fVar31 + -1.0 + (float)(-(uint)(fVar31 < 0.70710677) & (uint)fVar31);
            fVar46 = fVar44 + -1.0 + (float)(-(uint)(fVar44 < 0.70710677) & (uint)fVar44);
            auVar48._4_4_ = -(uint)(auVar51._4_4_ <= 0.0);
            auVar48._0_4_ = -(uint)(auVar51._0_4_ <= 0.0);
            auVar48._8_4_ = -(uint)(auVar51._8_4_ <= 0.0);
            auVar48._12_4_ = -(uint)(auVar51._12_4_ <= 0.0);
            auVar51._0_4_ =
                 (((float)(int)((auVar41._0_4_ >> 0x17) - 0x7e) -
                  (float)(-(uint)(fVar13 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar32 +
                 (((((((((fVar32 * 0.070376836 + -0.1151461) * fVar32 + 0.116769984) * fVar32 +
                       -0.12420141) * fVar32 + 0.14249323) * fVar32 + -0.16668057) * fVar32 +
                    0.20000714) * fVar32 + -0.24999994) * fVar32 + 0.3333333) * fVar32 + -0.5) *
                 fVar32 * fVar32) * 0.4342945;
            auVar51._4_4_ =
                 (((float)(int)((auVar41._4_4_ >> 0x17) - 0x7e) -
                  (float)(-(uint)(fVar24 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar43 +
                 (((((((((fVar43 * 0.070376836 + -0.1151461) * fVar43 + 0.116769984) * fVar43 +
                       -0.12420141) * fVar43 + 0.14249323) * fVar43 + -0.16668057) * fVar43 +
                    0.20000714) * fVar43 + -0.24999994) * fVar43 + 0.3333333) * fVar43 + -0.5) *
                 fVar43 * fVar43) * 0.4342945;
            auVar51._8_4_ =
                 (((float)(int)((auVar41._8_4_ >> 0x17) - 0x7e) -
                  (float)(-(uint)(fVar31 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar45 +
                 (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 + 0.116769984) * fVar45 +
                       -0.12420141) * fVar45 + 0.14249323) * fVar45 + -0.16668057) * fVar45 +
                    0.20000714) * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 + -0.5) *
                 fVar45 * fVar45) * 0.4342945;
            auVar51._12_4_ =
                 (((float)(int)((auVar41._12_4_ >> 0x17) - 0x7e) -
                  (float)(-(uint)(fVar44 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar46 +
                 (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) * fVar46 +
                       -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057) * fVar46 +
                    0.20000714) * fVar46 + -0.24999994) * fVar46 + 0.3333333) * fVar46 + -0.5) *
                 fVar46 * fVar46) * 0.4342945;
            *pauVar7 = auVar51 | auVar48;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = log10f(*(float *)(*pauVar7 + lVar8 * 4));
            *(float *)(*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    break;
  case 0x12:
    iVar3 = fegetround();
    fesetround(0);
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pfVar5 = (float *)(bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                          (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar2 = 3;
          do {
            *pfVar5 = (float)(int)*pfVar5;
            pfVar5[1] = (float)(int)pfVar5[1];
            pfVar5[2] = (float)(int)pfVar5[2];
            pfVar5[3] = (float)(int)pfVar5[3];
            pfVar5 = pfVar5 + 4;
            iVar2 = iVar2 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar2 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = nearbyintf(pfVar5[lVar8]);
            pfVar5[lVar8] = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
    fesetround(iVar3);
    break;
  case 0x13:
    iVar1 = bottom_top_blob->c;
    if (0 < (long)iVar1) {
      uVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
              bottom_top_blob->elempack;
      lVar6 = 0;
      do {
        pauVar7 = (undefined1 (*) [16])
                  (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                  (long)bottom_top_blob->data);
        if ((int)uVar4 < 4) {
          uVar9 = 0;
        }
        else {
          iVar3 = 3;
          do {
            auVar64._0_4_ = (float)(int)*(float *)*pauVar7;
            auVar64._4_4_ = (float)(int)*(float *)((long)*pauVar7 + 4);
            auVar64._8_4_ = (float)(int)*(float *)((long)*pauVar7 + 8);
            auVar64._12_4_ = (float)(int)*(float *)((long)*pauVar7 + 0xc);
            *pauVar7 = auVar64;
            pauVar7 = pauVar7 + 1;
            iVar3 = iVar3 + 4;
            uVar9 = uVar4 & 0xfffffffc;
          } while (iVar3 < (int)uVar4);
        }
        if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
          lVar8 = 0;
          do {
            fVar13 = truncf(*(float *)((long)*pauVar7 + lVar8 * 4));
            *(float *)((long)*pauVar7 + lVar8 * 4) = fVar13;
            lVar8 = lVar8 + 1;
          } while (uVar4 - uVar9 != (int)lVar8);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != iVar1);
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    if (op_type == Operation_ROUND)
    {
        // round to nearest even
#ifdef FE_TONEAREST
        int old_rm = fegetround();
        fesetround(FE_TONEAREST);
#endif
        int ret = unary_op_inplace<unary_op_round>(bottom_top_blob, opt);
#ifdef FE_TONEAREST
        fesetround(old_rm);
#endif
        return ret;
    }

    if (op_type == Operation_TRUNC)
        return unary_op_inplace<unary_op_trunc>(bottom_top_blob, opt);

    return 0;
}